

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> * __thiscall
mxx::gatherv<TwoBSA<unsigned_int>>
          (vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
           *__return_storage_ptr__,mxx *this,TwoBSA<unsigned_int> *data,size_t size,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm)

{
  int iVar1;
  int iVar2;
  const_iterator __first;
  const_iterator __last;
  reference out;
  undefined4 in_register_0000008c;
  size_t total_size;
  comm *comm_local;
  int root_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes_local;
  size_t size_local;
  TwoBSA<unsigned_int> *data_local;
  vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> *result;
  
  std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::vector
            (__return_storage_ptr__);
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)size);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)size);
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__last._M_current,0);
  iVar2 = mxx::comm::rank((comm *)CONCAT44(in_register_0000008c,root));
  if (iVar2 == (int)recv_sizes) {
    std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::resize
              (__return_storage_ptr__,(long)iVar1);
  }
  out = std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::operator[]
                  (__return_storage_ptr__,0);
  gatherv<TwoBSA<unsigned_int>>
            ((TwoBSA<unsigned_int> *)this,(size_t)data,out,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)size,(int)recv_sizes,
             (comm *)CONCAT44(in_register_0000008c,root));
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    if (comm.rank() == root)
        result.resize(total_size);
    gatherv(data, size, &result[0], recv_sizes, root, comm);
    return result;
}